

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_id.cpp
# Opt level: O2

spv_result_t spvtools::val::IdPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint32_t id;
  uint uVar2;
  pointer psVar3;
  bool bVar4;
  bool bVar5;
  int32_t iVar6;
  spv_result_t sVar7;
  Instruction *pIVar8;
  char *pcVar9;
  Op op;
  uint __args;
  ulong uVar10;
  uint32_t local_25c;
  string local_248;
  function<bool_(unsigned_int)> can_have_forward_declared_ids;
  DiagnosticStream local_208;
  
  bVar4 = spvIsExtendedInstruction((uint)(inst->inst_).opcode);
  if ((bVar4) && (bVar4 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type), bVar4)) {
    spvDbgInfoExtOperandCanBeForwardDeclaredFunction
              (&can_have_forward_declared_ids,(uint)(inst->inst_).opcode,(inst->inst_).ext_inst_type
               ,(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[4]);
  }
  else {
    spvOperandCanBeForwardDeclaredFunction
              (&can_have_forward_declared_ids,(uint)(inst->inst_).opcode);
  }
  __args = 0;
  bVar4 = false;
  local_25c = 0;
  while( true ) {
    uVar10 = (ulong)__args;
    psVar3 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->operands_).
                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4) <= uVar10)
    break;
    if (6 < psVar3[uVar10].type - SPV_OPERAND_TYPE_ID) goto switchD_0016f4f2_caseD_6;
    id = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[psVar3[uVar10].offset];
    switch(psVar3[uVar10].type) {
    default:
      pIVar8 = ValidationState_t::FindDef(_,id);
      if (pIVar8 == (Instruction *)0x0) {
        bVar5 = std::function<bool_(unsigned_int)>::operator()
                          (&can_have_forward_declared_ids,__args);
        if (!bVar5) goto LAB_0016f73c;
        iVar6 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
        if ((iVar6 == 0) || (bVar4 = ValidationState_t::IsForwardPointer(_,id), bVar4)) {
          sVar7 = ValidationState_t::ForwardDeclareId(_,id);
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,"Operand ");
          ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
          std::operator<<((ostream *)&local_208,(string *)&local_248);
          std::operator<<((ostream *)&local_208," requires a previous definition");
          sVar7 = local_208.error_;
          std::__cxx11::string::_M_dispose();
          DiagnosticStream::~DiagnosticStream(&local_208);
        }
        bVar4 = true;
        goto LAB_0016f820;
      }
      uVar1 = (inst->inst_).opcode;
      op = (Op)uVar1;
      iVar6 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode);
      if (iVar6 == 0) {
LAB_0016f55f:
        if (((((((pIVar8->inst_).type_id != 0) || (iVar6 = spvOpcodeGeneratesType(op), iVar6 != 0))
              || (bVar5 = spvOpcodeIsDebug(op), bVar5)) ||
             (((bVar5 = Instruction::IsDebugInfo(inst), bVar5 ||
               (bVar5 = Instruction::IsNonSemantic(inst), bVar5)) ||
              ((bVar5 = spvOpcodeIsDecoration(op), bVar5 || (bVar5 = spvOpcodeIsBranch(op), bVar5)))
              ))) || ((op < OpFunctionParameter &&
                      ((0x40000000001800U >> ((ulong)op & 0x3f) & 1) != 0)))) ||
           (((op - OpPhi < 3 ||
             (((op == OpSizeOf || (op == OpExtInstWithForwardRefsKHR)) ||
              (op == OpCooperativeMatrixLengthKHR)))) ||
            (((op == OpCooperativeMatrixLengthNV ||
              (bVar5 = spvOpcodeGeneratesUntypedPointer(op), op == OpUntypedArrayLengthKHR || bVar5)
              ) || ((op == OpSpecConstantOp &&
                    ((uVar2 = (inst->words_).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start[3], uVar2 == 0x116c ||
                     (uVar2 == 0x14f2)))))))))) {
          bVar5 = Instruction::IsNonSemantic(pIVar8);
          if ((!bVar5) || (bVar5 = Instruction::IsNonSemantic(inst), bVar5)) break;
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,"Operand ");
          ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
          std::operator<<((ostream *)&local_208,(string *)&local_248);
          pcVar9 = " in semantic instruction cannot be a non-semantic instruction";
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::operator<<((ostream *)&local_208,"Operand ");
          ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
          std::operator<<((ostream *)&local_208,(string *)&local_248);
          pcVar9 = " requires a type";
        }
      }
      else {
        iVar6 = spvOpcodeGeneratesType(op);
        if (((((((iVar6 != 0) || (bVar5 = spvOpcodeIsDebug((uint)uVar1), bVar5)) ||
               (bVar5 = Instruction::IsDebugInfo(inst), bVar5)) ||
              ((bVar5 = Instruction::IsNonSemantic(inst), bVar5 ||
               (bVar5 = spvOpcodeIsDecoration(op), bVar5)))) || (op == OpFunction)) ||
            (((op == OpSizeOf || (op == OpCooperativeMatrixLengthKHR)) ||
             ((op == OpCooperativeMatrixLengthNV ||
              (bVar5 = spvOpcodeGeneratesUntypedPointer(op), op == OpUntypedArrayLengthKHR || bVar5)
              ))))) ||
           ((op == OpSpecConstantOp &&
            ((uVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_start[3], uVar2 == 0x116c ||
             (uVar2 == 0x14f2)))))) goto LAB_0016f55f;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"Operand ");
        ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
        std::operator<<((ostream *)&local_208,(string *)&local_248);
        pcVar9 = " cannot be a type";
      }
      std::operator<<((ostream *)&local_208,pcVar9);
      std::__cxx11::string::_M_dispose();
      sVar7 = local_208.error_;
      goto LAB_0016f941;
    case SPV_OPERAND_TYPE_TYPE_ID:
      bVar5 = ValidationState_t::IsDefinedId(_,id);
      if (bVar5) {
        pIVar8 = ValidationState_t::FindDef(_,id);
        iVar6 = spvOpcodeGeneratesType((uint)(pIVar8->inst_).opcode);
        if (iVar6 != 0) break;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"ID ");
        ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
        std::operator<<((ostream *)&local_208,(string *)&local_248);
        pcVar9 = " is not a type id";
      }
      else {
LAB_0016f73c:
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_208,"ID ");
        ValidationState_t::getIdName_abi_cxx11_(&local_248,_,id);
        std::operator<<((ostream *)&local_208,(string *)&local_248);
        pcVar9 = " has not been defined";
      }
      std::operator<<((ostream *)&local_208,pcVar9);
      sVar7 = local_208.error_;
      std::__cxx11::string::_M_dispose();
      DiagnosticStream::~DiagnosticStream(&local_208);
LAB_0016f820:
      if (sVar7 != SPV_SUCCESS) goto LAB_0016f949;
      break;
    case SPV_OPERAND_TYPE_RESULT_ID:
      local_25c = id;
      break;
    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
      break;
    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
      if (((inst->inst_).opcode == 0x1151) && (bVar5 = Instruction::IsNonSemantic(inst), !bVar5)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar9 = "OpExtInstWithForwardRefsKHR is only allowed with non-semantic instructions.";
        goto LAB_0016f932;
      }
    }
switchD_0016f4f2_caseD_6:
    __args = __args + 1;
  }
  if ((inst->inst_).opcode == 0x1151 && !bVar4) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar9 = "Opcode OpExtInstWithForwardRefsKHR must have at least one forward declared ID.";
LAB_0016f932:
    std::operator<<((ostream *)&local_208,pcVar9);
    sVar7 = local_208.error_;
LAB_0016f941:
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  else {
    sVar7 = SPV_SUCCESS;
    if (local_25c != 0) {
      ValidationState_t::RemoveIfForwardDeclared(_,local_25c);
    }
  }
LAB_0016f949:
  if (can_have_forward_declared_ids.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*can_have_forward_declared_ids.super__Function_base._M_manager)
              ((_Any_data *)&can_have_forward_declared_ids,
               (_Any_data *)&can_have_forward_declared_ids,__destroy_functor);
  }
  return sVar7;
}

Assistant:

spv_result_t IdPass(ValidationState_t& _, Instruction* inst) {
  auto can_have_forward_declared_ids =
      spvIsExtendedInstruction(inst->opcode()) &&
              spvExtInstIsDebugInfo(inst->ext_inst_type())
          ? spvDbgInfoExtOperandCanBeForwardDeclaredFunction(
                inst->opcode(), inst->ext_inst_type(), inst->word(4))
          : spvOperandCanBeForwardDeclaredFunction(inst->opcode());

  // Keep track of a result id defined by this instruction.  0 means it
  // does not define an id.
  uint32_t result_id = 0;
  bool has_forward_declared_ids = false;

  for (unsigned i = 0; i < inst->operands().size(); i++) {
    const spv_parsed_operand_t& operand = inst->operand(i);
    const spv_operand_type_t& type = operand.type;
    // We only care about Id operands, which are a single word.
    const uint32_t operand_word = inst->word(operand.offset);

    auto ret = SPV_ERROR_INTERNAL;
    switch (type) {
      case SPV_OPERAND_TYPE_RESULT_ID:
        // NOTE: Multiple Id definitions are being checked by the binary parser.
        //
        // Defer undefined-forward-reference removal until after we've analyzed
        // the remaining operands to this instruction.  Deferral only matters
        // for OpPhi since it's the only case where it defines its own forward
        // reference.  Other instructions that can have forward references
        // either don't define a value or the forward reference is to a function
        // Id (and hence defined outside of a function body).
        result_id = operand_word;
        // NOTE: The result Id is added (in RegisterInstruction) *after* all of
        // the other Ids have been checked to avoid premature use in the same
        // instruction.
        ret = SPV_SUCCESS;
        break;
      case SPV_OPERAND_TYPE_ID:
      case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      case SPV_OPERAND_TYPE_SCOPE_ID:
        if (const auto def = _.FindDef(operand_word)) {
          const auto opcode = inst->opcode();
          if (spvOpcodeGeneratesType(def->opcode()) &&
              !spvOpcodeGeneratesType(opcode) && !spvOpcodeIsDebug(opcode) &&
              !inst->IsDebugInfo() && !inst->IsNonSemantic() &&
              !spvOpcodeIsDecoration(opcode) && opcode != spv::Op::OpFunction &&
              opcode != spv::Op::OpSizeOf &&
              opcode != spv::Op::OpCooperativeMatrixLengthNV &&
              opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
              !spvOpcodeGeneratesUntypedPointer(opcode) &&
              opcode != spv::Op::OpUntypedArrayLengthKHR &&
              !(opcode == spv::Op::OpSpecConstantOp &&
                (spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthNV ||
                 spv::Op(inst->word(3)) ==
                     spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " cannot be a type";
          } else if (def->type_id() == 0 && !spvOpcodeGeneratesType(opcode) &&
                     !spvOpcodeIsDebug(opcode) && !inst->IsDebugInfo() &&
                     !inst->IsNonSemantic() && !spvOpcodeIsDecoration(opcode) &&
                     !spvOpcodeIsBranch(opcode) && opcode != spv::Op::OpPhi &&
                     opcode != spv::Op::OpExtInst &&
                     opcode != spv::Op::OpExtInstWithForwardRefsKHR &&
                     opcode != spv::Op::OpExtInstImport &&
                     opcode != spv::Op::OpSelectionMerge &&
                     opcode != spv::Op::OpLoopMerge &&
                     opcode != spv::Op::OpFunction &&
                     opcode != spv::Op::OpSizeOf &&
                     opcode != spv::Op::OpCooperativeMatrixLengthNV &&
                     opcode != spv::Op::OpCooperativeMatrixLengthKHR &&
                     !spvOpcodeGeneratesUntypedPointer(opcode) &&
                     opcode != spv::Op::OpUntypedArrayLengthKHR &&
                     !(opcode == spv::Op::OpSpecConstantOp &&
                       (spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthNV ||
                        spv::Op(inst->word(3)) ==
                            spv::Op::OpCooperativeMatrixLengthKHR))) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " requires a type";
          } else if (def->IsNonSemantic() && !inst->IsNonSemantic()) {
            return _.diag(SPV_ERROR_INVALID_ID, inst)
                   << "Operand " << _.getIdName(operand_word)
                   << " in semantic instruction cannot be a non-semantic "
                      "instruction";
          } else {
            ret = SPV_SUCCESS;
          }
        } else if (can_have_forward_declared_ids(i)) {
          has_forward_declared_ids = true;
          if (spvOpcodeGeneratesType(inst->opcode()) &&
              !_.IsForwardPointer(operand_word)) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "Operand " << _.getIdName(operand_word)
                  << " requires a previous definition";
          } else {
            ret = _.ForwardDeclareId(operand_word);
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_TYPE_ID:
        if (_.IsDefinedId(operand_word)) {
          auto* def = _.FindDef(operand_word);
          if (!spvOpcodeGeneratesType(def->opcode())) {
            ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                  << "ID " << _.getIdName(operand_word) << " is not a type id";
          } else {
            ret = SPV_SUCCESS;
          }
        } else {
          ret = _.diag(SPV_ERROR_INVALID_ID, inst)
                << "ID " << _.getIdName(operand_word)
                << " has not been defined";
        }
        break;
      case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
        // Ideally, this check would live in validate_extensions.cpp. But since
        // forward references are only allowed on non-semantic instructions, and
        // ID validation is done first, we would fail with a "ID had not been
        // defined" error before we could give a more helpful message. For this
        // reason, this test is done here, so we can be more helpful to the
        // user.
        if (inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR &&
            !inst->IsNonSemantic())
          return _.diag(SPV_ERROR_INVALID_DATA, inst)
                 << "OpExtInstWithForwardRefsKHR is only allowed with "
                    "non-semantic instructions.";
        ret = SPV_SUCCESS;
        break;
      default:
        ret = SPV_SUCCESS;
        break;
    }
    if (SPV_SUCCESS != ret) return ret;
  }
  const bool must_have_forward_declared_ids =
      inst->opcode() == spv::Op::OpExtInstWithForwardRefsKHR;
  if (must_have_forward_declared_ids && !has_forward_declared_ids) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Opcode OpExtInstWithForwardRefsKHR must have at least one "
              "forward "
              "declared ID.";
  }

  if (result_id) _.RemoveIfForwardDeclared(result_id);

  return SPV_SUCCESS;
}